

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

BEGIN_HANDLE
begin_create(transfer_number next_outgoing_id_value,uint32_t incoming_window_value,
            uint32_t outgoing_window_value)

{
  int iVar1;
  BEGIN_HANDLE __ptr;
  AMQP_VALUE value;
  AMQP_VALUE item_value;
  AMQP_VALUE item_value_00;
  AMQP_VALUE value_00;
  BEGIN_INSTANCE *begin_instance;
  bool bVar2;
  
  __ptr = (BEGIN_HANDLE)malloc(8);
  if (__ptr != (BEGIN_HANDLE)0x0) {
    value = amqpvalue_create_composite_with_ulong_descriptor(0x11);
    __ptr->composite_value = value;
    if (value != (AMQP_VALUE)0x0) {
      item_value = amqpvalue_create_uint(next_outgoing_id_value);
      iVar1 = amqpvalue_set_composite_item(value,1,item_value);
      item_value_00 = amqpvalue_create_uint(incoming_window_value);
      bVar2 = iVar1 == 0;
      if (bVar2) {
        iVar1 = amqpvalue_set_composite_item(value,2,item_value_00);
        bVar2 = iVar1 == 0;
      }
      value_00 = amqpvalue_create_uint(outgoing_window_value);
      if (bVar2) {
        iVar1 = amqpvalue_set_composite_item(value,3,value_00);
        amqpvalue_destroy(item_value);
        amqpvalue_destroy(item_value_00);
        amqpvalue_destroy(value_00);
        if (iVar1 == 0) {
          return __ptr;
        }
      }
      else {
        amqpvalue_destroy(item_value);
        amqpvalue_destroy(item_value_00);
        amqpvalue_destroy(value_00);
      }
      amqpvalue_destroy(value);
    }
    free(__ptr);
  }
  return (BEGIN_HANDLE)0x0;
}

Assistant:

BEGIN_HANDLE begin_create(transfer_number next_outgoing_id_value, uint32_t incoming_window_value, uint32_t outgoing_window_value)
{
    BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)malloc(sizeof(BEGIN_INSTANCE));
    if (begin_instance != NULL)
    {
        begin_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(17);
        if (begin_instance->composite_value == NULL)
        {
            free(begin_instance);
            begin_instance = NULL;
        }
        else
        {
            AMQP_VALUE next_outgoing_id_amqp_value;
            AMQP_VALUE incoming_window_amqp_value;
            AMQP_VALUE outgoing_window_amqp_value;
            int result = 0;

            next_outgoing_id_amqp_value = amqpvalue_create_transfer_number(next_outgoing_id_value);
            if ((result == 0) && (amqpvalue_set_composite_item(begin_instance->composite_value, 1, next_outgoing_id_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }
            incoming_window_amqp_value = amqpvalue_create_uint(incoming_window_value);
            if ((result == 0) && (amqpvalue_set_composite_item(begin_instance->composite_value, 2, incoming_window_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }
            outgoing_window_amqp_value = amqpvalue_create_uint(outgoing_window_value);
            if ((result == 0) && (amqpvalue_set_composite_item(begin_instance->composite_value, 3, outgoing_window_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(next_outgoing_id_amqp_value);
            amqpvalue_destroy(incoming_window_amqp_value);
            amqpvalue_destroy(outgoing_window_amqp_value);
            if (result != 0)
            {
                begin_destroy(begin_instance);
                begin_instance = NULL;
            }
        }
    }

    return begin_instance;
}